

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::DisposeIntersectNodes(Clipper *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  ulong uVar3;
  
  ppIVar1 = (this->m_IntersectList).
            super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppIVar2 = (this->m_IntersectList).
            super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar2 != ppIVar1) {
    uVar3 = 0;
    do {
      if (ppIVar1[uVar3] != (IntersectNode *)0x0) {
        operator_delete(ppIVar1[uVar3],0x20);
      }
      uVar3 = uVar3 + 1;
      ppIVar1 = (this->m_IntersectList).
                super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppIVar2 = (this->m_IntersectList).
                super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar3 < (ulong)((long)ppIVar2 - (long)ppIVar1 >> 3));
  }
  if (ppIVar2 != ppIVar1) {
    (this->m_IntersectList).
    super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppIVar1;
  }
  return;
}

Assistant:

void Clipper::DisposeIntersectNodes()
{
  for (size_t i = 0; i < m_IntersectList.size(); ++i )
    delete m_IntersectList[i];
  m_IntersectList.clear();
}